

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_LDRSBT_ri(DisasContext_conflict1 *s,arg_ldst_ri *a)

{
  ARMMMUIdx AVar1;
  _Bool _Var2;
  int mem_idx;
  
  AVar1 = s->mmu_idx;
  mem_idx = 0;
  if ((int)AVar1 < 0x40) {
    if (AVar1 - ARMMMUIdx_SE10_0 < 4) {
      mem_idx = 7;
    }
    else {
      mem_idx = 0;
      if ((2 < AVar1 - ARMMMUIdx_E10_1) && (mem_idx = 0, AVar1 != ARMMMUIdx_E10_0))
      goto switchD_00659e27_default;
    }
  }
  else {
    switch(AVar1) {
    case ARMMMUIdx_MUser:
    case ARMMMUIdx_MPriv:
      break;
    case ARMMMUIdx_MUserNegPri:
    case ARMMMUIdx_MPrivNegPri:
      mem_idx = 2;
      break;
    case ARMMMUIdx_MSUser:
    case ARMMMUIdx_MSPriv:
      mem_idx = 4;
      break;
    case ARMMMUIdx_MSUserNegPri:
    case ARMMMUIdx_MSPrivNegPri:
      mem_idx = 6;
      break;
    default:
switchD_00659e27_default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.c"
                 ,0xa2,(char *)0x0);
    }
  }
  _Var2 = op_load_ri(s,a,MO_ASHIFT,mem_idx);
  return _Var2;
}

Assistant:

static inline int get_a32_user_mem_index(DisasContext *s)
{
    /* Return the core mmu_idx to use for A32/T32 "unprivileged load/store"
     * insns:
     *  if PL2, UNPREDICTABLE (we choose to implement as if PL0)
     *  otherwise, access as if at PL0.
     */
    switch (s->mmu_idx) {
    case ARMMMUIdx_E2:        /* this one is UNPREDICTABLE */
    case ARMMMUIdx_E10_0:
    case ARMMMUIdx_E10_1:
    case ARMMMUIdx_E10_1_PAN:
        return arm_to_core_mmu_idx(ARMMMUIdx_E10_0);
    case ARMMMUIdx_SE3:
    case ARMMMUIdx_SE10_0:
    case ARMMMUIdx_SE10_1:
    case ARMMMUIdx_SE10_1_PAN:
        return arm_to_core_mmu_idx(ARMMMUIdx_SE10_0);
    case ARMMMUIdx_MUser:
    case ARMMMUIdx_MPriv:
        return arm_to_core_mmu_idx(ARMMMUIdx_MUser);
    case ARMMMUIdx_MUserNegPri:
    case ARMMMUIdx_MPrivNegPri:
        return arm_to_core_mmu_idx(ARMMMUIdx_MUserNegPri);
    case ARMMMUIdx_MSUser:
    case ARMMMUIdx_MSPriv:
        return arm_to_core_mmu_idx(ARMMMUIdx_MSUser);
    case ARMMMUIdx_MSUserNegPri:
    case ARMMMUIdx_MSPrivNegPri:
        return arm_to_core_mmu_idx(ARMMMUIdx_MSUserNegPri);
    default:
        g_assert_not_reached();
        // never reach here
        return 0;
    }
}